

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O2

char * uo_base64_encode(char *dst,void *src,size_t src_len)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  
  pcVar4 = dst + ((src_len * 4) / 3 + 3 & 0x7ffffffffffffffc);
  lVar6 = (long)src + src_len;
  pcVar7 = pcVar4;
  if (src_len % 3 == 2) {
    bVar2 = *(byte *)(lVar6 + -1);
    bVar1 = *(byte *)(lVar6 + -2);
    lVar6 = lVar6 + -2;
    pcVar4[-1] = '=';
    pcVar4[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(ulong)(bVar2 & 0xf) * 4];
    uVar5 = (uint)(bVar2 >> 4) | (bVar1 & 3) << 4;
  }
  else {
    if (src_len % 3 != 1) goto LAB_00101ed1;
    bVar1 = *(byte *)(lVar6 + -1);
    lVar6 = lVar6 + -1;
    pcVar4[-2] = '=';
    pcVar4[-1] = '=';
    uVar5 = (bVar1 & 3) << 4;
  }
  uVar3 = (uint)bVar1;
  while( true ) {
    pcVar7[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar5];
    pcVar7[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar3 >> 2];
    pcVar7 = pcVar7 + -4;
LAB_00101ed1:
    if (pcVar7 <= dst) break;
    bVar2 = *(byte *)(lVar6 + -1);
    bVar1 = *(byte *)(lVar6 + -2);
    uVar3 = (uint)*(byte *)(lVar6 + -3);
    lVar6 = lVar6 + -3;
    pcVar7[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 & 0x3f];
    pcVar7[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)(bVar2 >> 6) + (bVar1 & 0xf) * 4];
    uVar5 = (uint)(bVar1 >> 4) | (uVar3 & 3) << 4;
  }
  return pcVar4;
}

Assistant:

char *uo_base64_encode(
    char *dst, 
    const void *src, 
    size_t src_len)
{
    unsigned char *end = dst + ((src_len * 4 / 3 + 3) & ~3);
    unsigned char *a = end;
    const unsigned char *b = (unsigned char *)src + src_len;
    unsigned char b0, b1, b2;

    switch (src_len % 3)
    {
        case 1:
            b0 = *--b;

            *--a = '=';
            *--a = '=';
            *--a = btoa[(b0 & 0x03) << 4];
            *--a = btoa[b0 >> 2];

            break;

        case 2:
            b1 = *--b;
            b0 = *--b;
            
            *--a = '=';
            *--a = btoa[(b1 & 0x0F) << 2];
            *--a = btoa[(b0 & 0x03) << 4 | b1 >> 4];
            *--a = btoa[b0 >> 2];

            break;
    }

    while ((char *)a > dst)
    {
        b2 = *--b;
        b1 = *--b;
        b0 = *--b;
        
        *--a = btoa[b2 & 0x3F];
        *--a = btoa[(b1 & 0x0F) << 2 | b2 >> 6];
        *--a = btoa[(b0 & 0x03) << 4 | b1 >> 4];
        *--a = btoa[b0 >> 2];
    }

    return end;
}